

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O0

void __thiscall
QuickImpl::ProcessBye(QuickImpl *this,string *ip,uint16_t port,uint8_t *data,int16_t data_len)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  pointer ppVar4;
  pointer pQVar5;
  Location local_78;
  Location local_60;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
  local_48;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
  local_40;
  iterator iter;
  QuickBye *bye;
  int16_t data_len_local;
  uint8_t *data_local;
  uint16_t port_local;
  string *ip_local;
  QuickImpl *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
               )data;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>_>
       ::find(&this->_connections,(key_type *)(data + 1));
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>_>
       ::end(&this->_connections);
  bVar2 = std::__detail::operator==(&local_40,&local_48);
  if (bVar2) {
    dd::Location::Location
              (&local_60,"ProcessBye",
               "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc"
               ,0x114);
    LogWrapper::Write(&g_quic_log,&local_60,2,anon_var_dwarf_6db26,
                      (ulong)*(uint *)((long)iter.
                                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
                                             ._M_cur + 1));
  }
  else {
    dd::Location::Location
              (&local_78,"ProcessBye",
               "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc"
               ,0x118);
    uVar1 = *(uint *)((long)iter.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
                            ._M_cur + 1);
    uVar3 = std::__cxx11::string::c_str();
    LogWrapper::Write(&g_quic_log,&local_78,2,anon_var_dwarf_6db3d,(ulong)uVar1,uVar3,(uint)port);
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false,_false>
                           *)&local_40);
    pQVar5 = std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>::operator->
                       (&ppVar4->second);
    QuickConnection::SetServerState(pQVar5,false);
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false,_false>
                           *)&local_40);
    pQVar5 = std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>::operator->
                       (&ppVar4->second);
    QuickConnection::SetAllowReconnect(pQVar5,false);
    if ((this->_as_server & 1U) != 0) {
      std::
      unordered_map<unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>_>
      ::erase(&this->_connections,(iterator)local_40._M_cur);
    }
    (**(code **)(*(long *)this->_quick_cb + 0x18))
              (this->_quick_cb,
               *(undefined4 *)
                ((long)iter.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
                       ._M_cur + 1));
  }
  return;
}

Assistant:

void QuickImpl::ProcessBye(const std::string &ip, uint16_t port, const uint8_t* data, int16_t data_len)
{
	QuickBye* bye = (QuickBye*)data;
	auto iter = _connections.find(bye->session_id);
	if (iter == _connections.end()) {
		g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�Ҳ�����Ӧ��session id %u, �޷������� byte ��Ϣ", bye->session_id);
		return;
	}

	g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�����ѶϿ���session id = %u, ip = %s, port = %d", bye->session_id, ip.c_str(), port);
	iter->second->SetServerState(false);
	iter->second->SetAllowReconnect(false);
	if (_as_server)
		_connections.erase(iter);
	_quick_cb->OnDisconnected(bye->session_id);
}